

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sortkey.cpp
# Opt level: O1

CollationKey * __thiscall icu_63::CollationKey::operator=(CollationKey *this,CollationKey *other)

{
  int iVar1;
  int32_t iVar2;
  uint8_t *puVar3;
  StackBufferOrFields *__src;
  StackBufferOrFields *__dest;
  uint newCapacity;
  
  if (this == other) {
    return this;
  }
  if (other->fHashCode != 2) {
    newCapacity = other->fFlagAndLength & 0x7fffffff;
    iVar1 = 0x20;
    if (this->fFlagAndLength < 0) {
      iVar1 = (this->fUnion).fFields.fCapacity;
    }
    if (((int)newCapacity <= iVar1) ||
       (puVar3 = reallocate(this,newCapacity,0), puVar3 != (uint8_t *)0x0)) {
      if (newCapacity != 0) {
        if (this->fFlagAndLength < 0) {
          __dest = (StackBufferOrFields *)(this->fUnion).fFields.fBytes;
        }
        else {
          __dest = &this->fUnion;
        }
        if (other->fFlagAndLength < 0) {
          __src = (StackBufferOrFields *)(other->fUnion).fFields.fBytes;
        }
        else {
          __src = &other->fUnion;
        }
        memcpy(__dest,__src,(ulong)newCapacity);
      }
      this->fFlagAndLength = this->fFlagAndLength & 0x80000000U | newCapacity;
      iVar2 = other->fHashCode;
      goto LAB_00225d50;
    }
  }
  this->fFlagAndLength = this->fFlagAndLength & 0x80000000;
  iVar2 = 2;
LAB_00225d50:
  this->fHashCode = iVar2;
  return this;
}

Assistant:

const CollationKey&
CollationKey::operator=(const CollationKey& other)
{
    if (this != &other)
    {
        if (other.isBogus())
        {
            return setToBogus();
        }

        int32_t length = other.getLength();
        if (length > getCapacity() && reallocate(length, 0) == NULL) {
            return setToBogus();
        }
        if (length > 0) {
            uprv_memcpy(getBytes(), other.getBytes(), length);
        }
        fFlagAndLength = (fFlagAndLength & 0x80000000) | length;
        fHashCode = other.fHashCode;
    }

    return *this;
}